

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerGraph.cpp
# Opt level: O2

void __thiscall dg::pta::PointerSubgraph::computeLoops(PointerSubgraph *this)

{
  pointer ppPVar1;
  pointer ppPVar2;
  PSNode *pPVar3;
  undefined8 *puVar4;
  long lVar5;
  long lVar6;
  mapped_type *pmVar7;
  pointer __args;
  PSNode *pPVar8;
  undefined8 *puVar9;
  SCC_t SCCs;
  PSNode *nd;
  vector<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>,_std::allocator<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>_>
  local_48;
  
  this[4] = (PointerSubgraph)0x1;
  memset((SCC<dg::pta::PSNode> *)&nd,0,0xf0);
  SCC<dg::pta::PSNode>::SCC((SCC<dg::pta::PSNode> *)&nd);
  SCC<dg::pta::PSNode>::_compute((SCC<dg::pta::PSNode> *)&nd,*(PSNode **)(this + 0x58));
  std::
  vector<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>,_std::allocator<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>_>
  ::vector(&SCCs,&local_48);
  SCC<dg::pta::PSNode>::~SCC((SCC<dg::pta::PSNode> *)&nd);
  __args = SCCs.
           super__Vector_base<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>,_std::allocator<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (__args == SCCs.
                  super__Vector_base<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>,_std::allocator<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      std::
      vector<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>,_std::allocator<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>_>
      ::~vector(&SCCs);
      return;
    }
    ppPVar1 = (__args->super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    ppPVar2 = (__args->super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>).
              _M_impl.super__Vector_impl_data._M_finish;
    if (ppPVar1 != ppPVar2) {
      if ((long)ppPVar2 - (long)ppPVar1 == 8) {
        pPVar3 = *ppPVar1;
        ppPVar1 = (pPVar3->super_SubgraphNode<dg::pta::PSNode>)._successors.
                  super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if ((long)(pPVar3->super_SubgraphNode<dg::pta::PSNode>)._successors.
                  super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)ppPVar1 == 8) {
          pPVar8 = *ppPVar1;
        }
        else {
          pPVar8 = (PSNode *)0x0;
        }
        if (pPVar8 != pPVar3) goto LAB_00116d37;
      }
      std::
      vector<std::vector<dg::pta::PSNode*,std::allocator<dg::pta::PSNode*>>,std::allocator<std::vector<dg::pta::PSNode*,std::allocator<dg::pta::PSNode*>>>>
      ::emplace_back<std::vector<dg::pta::PSNode*,std::allocator<dg::pta::PSNode*>>>
                ((vector<std::vector<dg::pta::PSNode*,std::allocator<dg::pta::PSNode*>>,std::allocator<std::vector<dg::pta::PSNode*,std::allocator<dg::pta::PSNode*>>>>
                  *)(this + 8),__args);
      puVar4 = *(undefined8 **)(*(long *)(this + 0x10) + -0x10);
      for (puVar9 = *(undefined8 **)(*(long *)(this + 0x10) + -0x18); puVar9 != puVar4;
          puVar9 = puVar9 + 1) {
        nd = (PSNode *)*puVar9;
        lVar5 = *(long *)(this + 0x10);
        lVar6 = *(long *)(this + 8);
        pmVar7 = std::__detail::
                 _Map_base<const_dg::pta::PSNode_*,_std::pair<const_dg::pta::PSNode_*const,_unsigned_long>,_std::allocator<std::pair<const_dg::pta::PSNode_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_dg::pta::PSNode_*>,_std::hash<const_dg::pta::PSNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<const_dg::pta::PSNode_*,_std::pair<const_dg::pta::PSNode_*const,_unsigned_long>,_std::allocator<std::pair<const_dg::pta::PSNode_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_dg::pta::PSNode_*>,_std::hash<const_dg::pta::PSNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)(this + 0x20),&nd);
        *pmVar7 = (lVar5 - lVar6) / 0x18 - 1;
      }
    }
LAB_00116d37:
    __args = __args + 1;
  } while( true );
}

Assistant:

void PointerSubgraph::computeLoops() {
    // FIXME: remember just that a node is on loop, not the whole loops

    assert(root);
    assert(!computedLoops() && "computeLoops() called repeatedly");
    _computed_loops = true;

    DBG(pta, "Computing information about loops");

    // compute the strongly connected components
    auto SCCs = SCC<PSNode>().compute(root);
    for (auto &scc : SCCs) {
        if (scc.empty())
            continue;
        // self-loop is also loop
        if (scc.size() == 1 && scc[0]->getSingleSuccessorOrNull() != scc[0])
            continue;

        _loops.push_back(std::move(scc));

        for (auto *nd : _loops.back()) {
            assert(_node_to_loop.find(nd) == _node_to_loop.end());
            _node_to_loop[nd] = _loops.size() - 1;
        }
    }
}